

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O3

void __thiscall duckdb::StringValueResult::RemoveLastLine(StringValueResult *this)

{
  ulong *puVar1;
  pointer ppVVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = this->chunk_col_id;
  if (uVar4 != 0) {
    ppVVar2 = (this->validity_mask).
              super_vector<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>.
              super__Vector_base<duckdb::ValidityMask_*,_std::allocator<duckdb::ValidityMask_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar5 = 0;
    do {
      lVar3 = (long)(ppVVar2[uVar5]->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (lVar3 != 0) {
        puVar1 = (ulong *)(lVar3 + ((ulong)this->number_of_rows >> 6) * 8);
        *puVar1 = *puVar1 | 1L << ((byte)this->number_of_rows & 0x3f);
        uVar4 = this->chunk_col_id;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar4);
  }
  this->cur_col_id = 0;
  this->chunk_col_id = 0;
  this->number_of_rows = this->number_of_rows + -1;
  return;
}

Assistant:

void StringValueResult::RemoveLastLine() {
	// potentially de-nullify values
	for (idx_t i = 0; i < chunk_col_id; i++) {
		validity_mask[i]->SetValid(static_cast<idx_t>(number_of_rows));
	}
	// reset column trackers
	cur_col_id = 0;
	chunk_col_id = 0;
	// decrement row counter
	number_of_rows--;
}